

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O0

void pmt_tests::pmt_test1_invoker(void)

{
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  pmt_test1 t;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1c8;
  std_string *in_stack_fffffffffffff1d0;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff1d8;
  pmt_test1 *in_stack_fffffffffffff1e8;
  const_string *in_stack_fffffffffffff1f0;
  size_t in_stack_fffffffffffff1f8;
  const_string *in_stack_fffffffffffff200;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff208;
  unit_test_log_t *this_00;
  pmt_test1 *in_stack_fffffffffffff330;
  const_string local_c38 [25];
  undefined1 local_aa0 [408];
  undefined1 local_908 [408];
  undefined1 local_770 [1488];
  undefined1 local_1a0 [408];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_1a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [10])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  pmt_test1::pmt_test1(in_stack_fffffffffffff1e8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [10])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [16])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::setup_conditional<pmt_tests::pmt_test1>((pmt_test1 *)0x8f2e3e);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_908,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [10])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [13])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  pmt_test1::test_method(in_stack_fffffffffffff330);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  memset(local_aa0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [10])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [19])in_stack_fffffffffffff1d0);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff208,in_stack_fffffffffffff200,in_stack_fffffffffffff1f8,
             in_stack_fffffffffffff1f0);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  boost::unit_test::teardown_conditional<pmt_tests::pmt_test1>((pmt_test1 *)0x8f308e);
  this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            ((basic_cstring<const_char> *)in_stack_fffffffffffff1d8,
             (pointer)in_stack_fffffffffffff1d0,(unsigned_long)in_stack_fffffffffffff1c8);
  file = local_c38;
  memset(file,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  line_num = boost::basic_wrap_stringstream<char>::ref(in_stack_fffffffffffff1c8);
  msg = boost::operator<<(in_stack_fffffffffffff1d8,(char *)in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [10])in_stack_fffffffffffff1d0);
  boost::operator<<(in_stack_fffffffffffff1d8,(char (*) [15])in_stack_fffffffffffff1d0);
  this = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff1d8);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,in_stack_fffffffffffff1d0);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_00,file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff1c8);
  pmt_test1::~pmt_test1((pmt_test1 *)in_stack_fffffffffffff1c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_test1)
{
    static const unsigned int tx_counts[] = {1, 4, 7, 17, 56, 100, 127, 256, 312, 513, 1000, 4095};

    for (int i = 0; i < 12; i++) {
        unsigned int nTx = tx_counts[i];

        // build a block with some dummy transactions
        CBlock block;
        for (unsigned int j=0; j<nTx; j++) {
            CMutableTransaction tx;
            tx.nLockTime = j; // actual transaction data doesn't matter; just make the nLockTime's unique
            block.vtx.push_back(MakeTransactionRef(std::move(tx)));
        }

        // calculate actual merkle root and height
        uint256 merkleRoot1 = BlockMerkleRoot(block);
        std::vector<uint256> vTxid(nTx, uint256());
        for (unsigned int j=0; j<nTx; j++)
            vTxid[j] = block.vtx[j]->GetHash();
        int nHeight = 1, nTx_ = nTx;
        while (nTx_ > 1) {
            nTx_ = (nTx_+1)/2;
            nHeight++;
        }

        // check with random subsets with inclusion chances 1, 1/2, 1/4, ..., 1/128
        for (int att = 1; att < 15; att++) {
            // build random subset of txid's
            std::vector<bool> vMatch(nTx, false);
            std::vector<uint256> vMatchTxid1;
            for (unsigned int j=0; j<nTx; j++) {
                bool fInclude = m_rng.randbits(att / 2) == 0;
                vMatch[j] = fInclude;
                if (fInclude)
                    vMatchTxid1.push_back(vTxid[j]);
            }

            // build the partial merkle tree
            CPartialMerkleTree pmt1(vTxid, vMatch);

            // serialize
            DataStream ss{};
            ss << pmt1;

            // verify CPartialMerkleTree's size guarantees
            unsigned int n = std::min<unsigned int>(nTx, 1 + vMatchTxid1.size()*nHeight);
            BOOST_CHECK(ss.size() <= 10 + (258*n+7)/8);

            // deserialize into a tester copy
            CPartialMerkleTreeTester pmt2{m_rng};
            ss >> pmt2;

            // extract merkle root and matched txids from copy
            std::vector<uint256> vMatchTxid2;
            std::vector<unsigned int> vIndex;
            uint256 merkleRoot2 = pmt2.ExtractMatches(vMatchTxid2, vIndex);

            // check that it has the same merkle root as the original, and a valid one
            BOOST_CHECK(merkleRoot1 == merkleRoot2);
            BOOST_CHECK(!merkleRoot2.IsNull());

            // check that it contains the matched transactions (in the same order!)
            BOOST_CHECK(vMatchTxid1 == vMatchTxid2);

            // check that random bit flips break the authentication
            for (int j=0; j<4; j++) {
                CPartialMerkleTreeTester pmt3(pmt2);
                pmt3.Damage();
                std::vector<uint256> vMatchTxid3;
                uint256 merkleRoot3 = pmt3.ExtractMatches(vMatchTxid3, vIndex);
                BOOST_CHECK(merkleRoot3 != merkleRoot1);
            }
        }
    }
}